

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBuilderBeamTaperedTimoshenkoFPM::BuildBeam
          (ChBuilderBeamTaperedTimoshenkoFPM *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM> *sect,int N,
          ChVector<double> *A,ChVector<double> *B,ChVector<double> Ydir)

{
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *this_00;
  undefined1 auVar1 [16];
  ChMesh *pCVar2;
  undefined1 auVar3 [16];
  int iVar4;
  long lVar5;
  double dVar6;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> nodeB;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> nodeA;
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> local_178;
  __shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2> local_168 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_158 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_148 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  ChVector<double> v_1;
  __shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
  local_118;
  ChVector<double> v;
  ChMatrix33<double> mrot;
  
  std::
  vector<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenkoFPM>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenkoFPM>_>_>
  ::clear(&this->beam_elems);
  this_00 = &this->beam_nodes;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::clear(this_00);
  v.m_data._0_16_ = vsubpd_avx(*(undefined1 (*) [16])B->m_data,*(undefined1 (*) [16])A->m_data);
  v.m_data[2] = B->m_data[2] - A->m_data[2];
  ChMatrix33<double>::Set_A_Xdir(&mrot,&v,(ChVector<double> *)Ydir.m_data[0]);
  ChFrame<double>::ChFrame((ChFrame<double> *)&v,A,&mrot);
  chrono_types::make_shared<chrono::fea::ChNodeFEAxyzrot,_chrono::ChFrame<double>,_0>
            ((chrono_types *)
             &nodeA.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>,
             (ChFrame<double> *)&v);
  pCVar2 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyzrot,void>
            (local_148,
             &nodeA.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>);
  ChMesh::AddNode(pCVar2,(shared_ptr<chrono::fea::ChNodeFEAbase> *)local_148);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140);
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::push_back(this_00,&nodeA);
  iVar4 = 1;
  for (lVar5 = 0; (ulong)(uint)(~(N >> 0x1f) & N) << 4 != lVar5; lVar5 = lVar5 + 0x10) {
    auVar1 = *(undefined1 (*) [16])A->m_data;
    dVar6 = (double)iVar4 / (double)N;
    auVar3 = vsubpd_avx(*(undefined1 (*) [16])B->m_data,auVar1);
    v_1.m_data[2] = A->m_data[2] + dVar6 * (B->m_data[2] - A->m_data[2]);
    v_1.m_data[0] = auVar1._0_8_ + dVar6 * auVar3._0_8_;
    v_1.m_data[1] = auVar1._8_8_ + dVar6 * auVar3._8_8_;
    ChFrame<double>::ChFrame((ChFrame<double> *)&v,&v_1,&mrot);
    chrono_types::make_shared<chrono::fea::ChNodeFEAxyzrot,_chrono::ChFrame<double>,_0>
              ((chrono_types *)
               &nodeB.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>,
               (ChFrame<double> *)&v);
    pCVar2 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::fea::ChNodeFEAxyzrot,void>
              (local_158,
               &nodeB.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>);
    ChMesh::AddNode(pCVar2,(shared_ptr<chrono::fea::ChNodeFEAbase> *)local_158);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150);
    std::
    vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
    ::push_back(this_00,(value_type *)
                        &nodeB.
                         super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
               );
    chrono_types::make_shared<chrono::fea::ChElementBeamTaperedTimoshenkoFPM,_0>();
    pCVar2 = (mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenkoFPM,void>
              (local_168,
               (__shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenkoFPM,_(__gnu_cxx::_Lock_policy)2>
                *)&v);
    ChMesh::AddElement(pCVar2,(shared_ptr<chrono::fea::ChElementBase> *)local_168);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160);
    std::
    vector<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenkoFPM>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamTaperedTimoshenkoFPM>_>_>
    ::push_back(&this->beam_elems,(value_type *)&v);
    dVar6 = v.m_data[0];
    std::__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_178,
               (__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((this_00->
                         super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr + lVar5));
    std::__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_188,
               (__shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(this_00->
                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[1].
                       super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + lVar5));
    (**(code **)(*(long *)dVar6 + 0xd0))(dVar6,&local_178,&local_188);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_188._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_178._M_refcount);
    dVar6 = v.m_data[0];
    std::
    __shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_118,
                   &sect->
                    super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                  );
    ChElementBeamTaperedTimoshenkoFPM::SetTaperedSection
              ((ChElementBeamTaperedTimoshenkoFPM *)dVar6,
               (shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM> *)
               &local_118);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(v.m_data + 1));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&nodeB.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    iVar4 = iVar4 + 1;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&nodeA.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void ChBuilderBeamTaperedTimoshenkoFPM::BuildBeam(
    std::shared_ptr<ChMesh> mesh,                                         // mesh to store the resulting elements
    std::shared_ptr<ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM> sect,  // section material for beam elements
    const int N,                                                          // number of elements in the segment
    const ChVector<> A,                                                   // starting point
    const ChVector<> B,                                                   // ending point
    const ChVector<> Ydir                                                 // the 'up' Y direction of the beam
) {
    beam_elems.clear();
    beam_nodes.clear();

    ChMatrix33<> mrot;
    mrot.Set_A_Xdir(B - A, Ydir);

    auto nodeA = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(A, mrot));
    mesh->AddNode(nodeA);
    beam_nodes.push_back(nodeA);

    for (int i = 1; i <= N; ++i) {
        double eta = (double)i / (double)N;
        ChVector<> pos = A + (B - A) * eta;

        auto nodeB = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(pos, mrot));
        mesh->AddNode(nodeB);
        beam_nodes.push_back(nodeB);

        auto element = chrono_types::make_shared<ChElementBeamTaperedTimoshenkoFPM>();
        mesh->AddElement(element);
        beam_elems.push_back(element);

        element->SetNodes(beam_nodes[i - 1], beam_nodes[i]);

        element->SetTaperedSection(sect);
    }
}